

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O2

unsigned_t __kmp_dispatch_guided_remaining<unsigned_int>(uint tc,floating_t base,unsigned_t idx)

{
  ulong uVar1;
  longdouble in_ST0;
  undefined4 local_18;
  
  __kmp_pow<unsigned_int>((longdouble *)(ulong)idx,(longdouble)base,idx);
  uVar1 = (ulong)ROUND((longdouble)tc * in_ST0);
  local_18 = (int)uVar1;
  return (uint)((longdouble)tc * in_ST0 != (longdouble)(uVar1 & 0xffffffff)) + local_18;
}

Assistant:

static __inline typename traits_t<T>::unsigned_t
__kmp_dispatch_guided_remaining(T tc, typename traits_t<T>::floating_t base,
                                typename traits_t<T>::unsigned_t idx) {
  /* Note: On Windows* OS on IA-32 architecture and Intel(R) 64, at
     least for ICL 8.1, long double arithmetic may not really have
     long double precision, even with /Qlong_double.  Currently, we
     workaround that in the caller code, by manipulating the FPCW for
     Windows* OS on IA-32 architecture.  The lack of precision is not
     expected to be a correctness issue, though.
  */
  typedef typename traits_t<T>::unsigned_t UT;

  long double x = tc * __kmp_pow<UT>(base, idx);
  UT r = (UT)x;
  if (x == r)
    return r;
  return r + 1;
}